

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ralocal.cpp
# Opt level: O0

uint32_t __thiscall
asmjit::v1_14::RALocalAllocator::decideOnAssignment
          (RALocalAllocator *this,RegGroup group,uint32_t workId,uint32_t physId,
          RegMask allocableRegs)

{
  uint32_t uVar1;
  RAWorkReg **ppRVar2;
  undefined8 *in_RDI;
  uint in_R8D;
  RegMask previouslyAssignedRegs;
  uint32_t homeId;
  RAWorkReg *workReg;
  char *in_stack_00000360;
  int in_stack_0000036c;
  char *in_stack_00000370;
  undefined4 in_stack_ffffffffffffff78;
  uint in_stack_ffffffffffffff7c;
  undefined1 local_74 [11];
  undefined1 local_69 [17];
  RAWorkReg *local_58;
  RAWorkReg *local_50;
  uint local_44 [5];
  undefined1 *local_30;
  undefined1 *local_28;
  RAWorkReg *local_20;
  uint *local_18;
  undefined8 local_8;
  
  if (in_R8D == 0) {
    DebugUtils::assertionFailed(in_stack_00000370,in_stack_0000036c,in_stack_00000360);
  }
  local_28 = local_69;
  local_30 = local_74;
  local_8 = *in_RDI;
  ppRVar2 = ZoneVector<asmjit::v1_14::RAWorkReg_*>::operator[]
                      ((ZoneVector<asmjit::v1_14::RAWorkReg_*> *)
                       CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),(size_t)in_RDI)
  ;
  local_58 = *ppRVar2;
  if (local_58[0x4a] != (RAWorkReg)0xff) {
    in_stack_ffffffffffffff7c = (uint)(byte)local_58[0x4a];
    local_18 = local_44;
    local_50 = local_58;
    local_44[0] = in_stack_ffffffffffffff7c;
    if ((in_R8D & 1 << ((byte)local_58[0x4a] & 0x1f)) != 0) {
      return in_stack_ffffffffffffff7c;
    }
  }
  local_20 = local_58;
  uVar1 = pickBestSuitableRegister
                    ((RALocalAllocator *)
                     CONCAT44(in_stack_ffffffffffffff7c,*(undefined4 *)(local_58 + 0x3c)),
                     (RegGroup)((ulong)in_RDI >> 0x38),(RegMask)in_RDI);
  return uVar1;
}

Assistant:

uint32_t RALocalAllocator::decideOnAssignment(RegGroup group, uint32_t workId, uint32_t physId, RegMask allocableRegs) const noexcept {
  ASMJIT_ASSERT(allocableRegs != 0);
  DebugUtils::unused(group, physId);

  RAWorkReg* workReg = workRegById(workId);

  // Prefer home register id, if possible.
  if (workReg->hasHomeRegId()) {
    uint32_t homeId = workReg->homeRegId();
    if (Support::bitTest(allocableRegs, homeId)) {
      return homeId;
    }
  }

  // Prefer registers used upon block entries.
  RegMask previouslyAssignedRegs = workReg->allocatedMask();
  if (allocableRegs & previouslyAssignedRegs) {
    allocableRegs &= previouslyAssignedRegs;
  }

  return pickBestSuitableRegister(group, allocableRegs);
}